

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::insertDefinition(Compilation *this,Symbol *symbol,Scope *scope)

{
  long lVar1;
  group_type_pointer pgVar2;
  RootSymbol *pRVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  undefined1 *puVar6;
  Symbol *pSVar7;
  Scope *pSVar8;
  uint uVar9;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *pvVar10;
  SymbolKind *pSVar11;
  Compilation **ppCVar12;
  bool bVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  SourceLibrary *pSVar18;
  SourceLibrary *pSVar19;
  ulong extraout_RAX;
  string_view *hash;
  SyntaxNode *sn;
  SourceLocation oldLoc;
  DiagCode DVar20;
  Compilation *pCVar21;
  hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
  *h;
  const_iterator __position;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *pos0;
  const_iterator cVar22;
  Symbol *pSVar23;
  Scope *pSVar24;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *ppVar25;
  ulong uVar26;
  value_type_pointer ppVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  byte bVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  byte bVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  byte bVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  byte bVar47;
  initializer_list<slang::ast::Symbol_*> __l;
  string_view name;
  undefined8 in_stack_fffffffffffffe98;
  try_emplace_args_t local_15a;
  allocator_type local_159;
  Compilation *local_158;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *local_150;
  hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
  *local_148;
  Scope *local_140;
  undefined8 local_138;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  byte bStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  Symbol *local_128;
  string_view *local_120;
  undefined8 local_118;
  uchar uStack_110;
  uchar uStack_10f;
  uchar uStack_10e;
  byte bStack_10d;
  uchar uStack_10c;
  uchar uStack_10b;
  uchar uStack_10a;
  byte bStack_109;
  anon_class_16_2_6b3e7b47 reportRedefinition;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> local_f8;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> key;
  locator local_a0;
  Token local_88;
  value_type_pointer local_78;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  Symbol *local_38;
  
  pRVar3 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  local_118 = &pRVar3->super_Scope;
  if (pRVar3 == (RootSymbol *)0x0) {
    local_118 = (Scope *)0x0;
  }
  local_140 = scope;
  if (scope->thisSym->kind == CompilationUnit) {
    local_140 = local_118;
  }
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = (symbol->name)._M_len;
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = (symbol->name)._M_str;
  if ((symbol->name)._M_len == 0) {
    return;
  }
  local_120 = &symbol->name;
  reportRedefinition.symbol = symbol;
  reportRedefinition.scope = scope;
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)local_140;
  sVar17 = boost::unordered::detail::foa::mulx_mix::
           mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                     ((hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
                       *)&this->definitionMap,&key);
  uVar28 = sVar17 >> ((byte)(this->definitionMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar1 = (sVar17 & 0xff) * 4;
  uVar32 = (&UNK_0040eb5c)[lVar1];
  uVar33 = (&UNK_0040eb5d)[lVar1];
  uVar34 = (&UNK_0040eb5e)[lVar1];
  bVar35 = (&UNK_0040eb5f)[lVar1];
  ppVar25 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *)
            0x0;
  uVar36 = uVar32;
  uVar37 = uVar33;
  uVar38 = uVar34;
  bVar39 = bVar35;
  uVar40 = uVar32;
  uVar41 = uVar33;
  uVar42 = uVar34;
  bVar43 = bVar35;
  uVar44 = uVar32;
  uVar45 = uVar33;
  uVar46 = uVar34;
  bVar47 = bVar35;
  local_158 = this;
  local_148 = (hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
               *)&this->definitionMap;
LAB_00256c79:
  pgVar4 = (this->definitionMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
           .arrays.groups_;
  pgVar2 = pgVar4 + uVar28;
  local_48 = pgVar2->m[0].n;
  uStack_47 = pgVar2->m[1].n;
  uStack_46 = pgVar2->m[2].n;
  bStack_45 = pgVar2->m[3].n;
  uStack_44 = pgVar2->m[4].n;
  uStack_43 = pgVar2->m[5].n;
  uStack_42 = pgVar2->m[6].n;
  bStack_41 = pgVar2->m[7].n;
  uStack_40 = pgVar2->m[8].n;
  uStack_3f = pgVar2->m[9].n;
  uStack_3e = pgVar2->m[10].n;
  bStack_3d = pgVar2->m[0xb].n;
  uStack_3c = pgVar2->m[0xc].n;
  uStack_3b = pgVar2->m[0xd].n;
  uStack_3a = pgVar2->m[0xe].n;
  bVar14 = pgVar2->m[0xf].n;
  auVar29[0] = -(local_48 == uVar32);
  auVar29[1] = -(uStack_47 == uVar33);
  auVar29[2] = -(uStack_46 == uVar34);
  auVar29[3] = -(bStack_45 == bVar35);
  auVar29[4] = -(uStack_44 == uVar36);
  auVar29[5] = -(uStack_43 == uVar37);
  auVar29[6] = -(uStack_42 == uVar38);
  auVar29[7] = -(bStack_41 == bVar39);
  auVar29[8] = -(uStack_40 == uVar40);
  auVar29[9] = -(uStack_3f == uVar41);
  auVar29[10] = -(uStack_3e == uVar42);
  auVar29[0xb] = -(bStack_3d == bVar43);
  auVar29[0xc] = -(uStack_3c == uVar44);
  auVar29[0xd] = -(uStack_3b == uVar45);
  auVar29[0xe] = -(uStack_3a == uVar46);
  auVar29[0xf] = -(bVar14 == bVar47);
  uVar15 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
  bStack_39 = bVar14;
  if (uVar15 != 0) {
    local_138._0_2_ = CONCAT11(uVar33,uVar32);
    local_138._0_3_ = CONCAT12(uVar34,(undefined2)local_138);
    local_138._0_4_ = CONCAT13(bVar35,(undefined3)local_138);
    local_138._0_5_ = CONCAT14(uVar36,(undefined4)local_138);
    local_138._0_6_ = CONCAT15(uVar37,(undefined5)local_138);
    local_138._0_7_ = CONCAT16(uVar38,(undefined6)local_138);
    local_138 = CONCAT17(bVar39,(undefined7)local_138);
    ppVar5 = (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.elements_;
    local_150 = ppVar25;
    uStack_130 = uVar40;
    uStack_12f = uVar41;
    uStack_12e = uVar42;
    bStack_12d = bVar43;
    uStack_12c = uVar44;
    uStack_12b = uVar45;
    uStack_12a = uVar46;
    bStack_129 = bVar47;
    local_128 = symbol;
LAB_00256cd1:
    uVar16 = 0;
    if (uVar15 != 0) {
      for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    ppVar27 = ppVar5 + uVar28 * 0xf + (ulong)uVar16;
    bVar13 = std::
             __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
             ::__eq(&key,&ppVar27->first);
    symbol = local_128;
    if (!bVar13) goto code_r0x00256cf6;
    __position._M_current =
         (ppVar27->second).first.
         super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (local_140 == local_118) {
      local_150 = &ppVar27->second;
      uVar28 = (long)(ppVar27->second).first.
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 3;
      while( true ) {
        uVar26 = uVar28;
        DVar20 = SUB84(in_stack_fffffffffffffe98,0);
        if ((long)uVar26 < 1) break;
        uVar28 = uVar26 >> 1;
        pSVar18 = Symbol::getSourceLibrary(__position._M_current[uVar28]);
        pSVar19 = Symbol::getSourceLibrary(symbol);
        if (pSVar18->priority < pSVar19->priority) {
          __position._M_current = __position._M_current + uVar28 + 1;
          uVar28 = ~uVar28 + uVar26;
        }
      }
      if (__position._M_current ==
          (ppVar27->second).first.
          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00257040:
        local_f8.first.
        super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)symbol;
        std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::_M_insert_rval
                  (&local_150->first,__position,(value_type *)&local_f8);
        goto LAB_00257055;
      }
      pSVar18 = Symbol::getSourceLibrary(symbol);
      local_138 = local_138 & 0xffffffff00000000;
      cVar22._M_current = __position._M_current;
      while( true ) {
        DVar20 = SUB84(in_stack_fffffffffffffe98,0);
        if (cVar22._M_current ==
            (ppVar27->second).first.
            super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00257040;
        pSVar23 = *cVar22._M_current;
        pSVar19 = Symbol::getSourceLibrary(pSVar23);
        DVar20 = SUB84(in_stack_fffffffffffffe98,0);
        if (pSVar19 == pSVar18) break;
        if (pSVar19->priority != pSVar18->priority) goto LAB_00257040;
LAB_0025703a:
        cVar22._M_current = cVar22._M_current + 1;
      }
      uVar28 = (ulong)pSVar23->kind;
      if (pSVar23->kind == symbol->kind) {
        if ((local_138 & 1) == 0) {
          insertDefinition::anon_class_16_2_6b3e7b47::operator()
                    (&reportRedefinition,pSVar23->location,(DiagCode)0x40000a);
          uVar28 = extraout_RAX;
        }
        local_138 = CONCAT44(local_138._4_4_,(int)CONCAT71((int7)(uVar28 >> 8),1));
        goto LAB_0025703a;
      }
      oldLoc = pSVar23->location;
      goto LAB_002572b9;
    }
    oldLoc = (*__position._M_current)->location;
    DVar20.subsystem = Lookup;
    DVar20.code = 0x40;
    goto LAB_00256f76;
  }
  goto LAB_00256d20;
code_r0x00256cf6:
  uVar15 = uVar15 - 1 & uVar15;
  if (uVar15 == 0) goto code_r0x00256cff;
  goto LAB_00256cd1;
code_r0x00256cff:
  bVar14 = pgVar4[uVar28].m[0xf].n;
  ppVar25 = local_150;
  this = local_158;
  uVar32 = (uchar)local_138;
  uVar33 = local_138._1_1_;
  uVar34 = local_138._2_1_;
  bVar35 = local_138._3_1_;
  uVar36 = local_138._4_1_;
  uVar37 = local_138._5_1_;
  uVar38 = local_138._6_1_;
  bVar39 = local_138._7_1_;
  uVar40 = uStack_130;
  uVar41 = uStack_12f;
  uVar42 = uStack_12e;
  bVar43 = bStack_12d;
  uVar44 = uStack_12c;
  uVar45 = uStack_12b;
  uVar46 = uStack_12a;
  bVar47 = bStack_129;
LAB_00256d20:
  h = local_148;
  if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
         is_not_overflowed(unsigned_long)::shift)[(uint)sVar17 & 7] & bVar14) == 0)
  goto LAB_00256d4e;
  puVar6 = (undefined1 *)
           (this->definitionMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
           .arrays.groups_size_mask;
  pvVar10 = &ppVar25->first;
  ppVar25 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *)
            ((long)&(ppVar25->first).
                    super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1);
  uVar28 = (long)&(pvVar10->
                  super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>).
                  _M_impl.super__Vector_impl_data._M_start + uVar28 + 1 & (ulong)puVar6;
  if (puVar6 < ppVar25) goto LAB_00256d4e;
  goto LAB_00256c79;
LAB_00256d4e:
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_38 = symbol;
  std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::vector
            ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)&local_88,__l,
             &local_159);
  local_f8.first.super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78;
  local_78 = (value_type_pointer)0x0;
  local_f8.second = local_140 != local_118;
  local_f8.first.super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._0_16_ = local_88;
  local_88.kind = Unknown;
  local_88._2_1_ = 0;
  local_88.numFlags.raw = '\0';
  local_88.rawLen = 0;
  local_88.info = (Info *)0x0;
  sVar17 = boost::unordered::detail::foa::mulx_mix::
           mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                     (h,&key);
  pos0 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *)
         (sVar17 >> ((byte)*h & 0x3f));
  lVar1 = (sVar17 & 0xff) * 4;
  uVar32 = (&UNK_0040eb5c)[lVar1];
  uVar33 = (&UNK_0040eb5d)[lVar1];
  uVar34 = (&UNK_0040eb5e)[lVar1];
  bVar35 = (&UNK_0040eb5f)[lVar1];
  pSVar23 = (Symbol *)0x0;
  ppVar25 = pos0;
  uVar36 = uVar32;
  uVar37 = uVar33;
  uVar38 = uVar34;
  bVar39 = bVar35;
  uVar40 = uVar32;
  uVar41 = uVar33;
  uVar42 = uVar34;
  bVar43 = bVar35;
  uVar44 = uVar32;
  uVar45 = uVar33;
  uVar46 = uVar34;
  bVar47 = bVar35;
  do {
    pgVar4 = (local_158->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    pgVar2 = pgVar4 + (long)ppVar25;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bVar14 = pgVar2->m[0xf].n;
    auVar30[0] = -(local_58 == uVar32);
    auVar30[1] = -(uStack_57 == uVar33);
    auVar30[2] = -(uStack_56 == uVar34);
    auVar30[3] = -(bStack_55 == bVar35);
    auVar30[4] = -(uStack_54 == uVar36);
    auVar30[5] = -(uStack_53 == uVar37);
    auVar30[6] = -(uStack_52 == uVar38);
    auVar30[7] = -(bStack_51 == bVar39);
    auVar30[8] = -(uStack_50 == uVar40);
    auVar30[9] = -(uStack_4f == uVar41);
    auVar30[10] = -(uStack_4e == uVar42);
    auVar30[0xb] = -(bStack_4d == bVar43);
    auVar30[0xc] = -(uStack_4c == uVar44);
    auVar30[0xd] = -(uStack_4b == uVar45);
    auVar30[0xe] = -(uStack_4a == uVar46);
    auVar30[0xf] = -(bVar14 == bVar47);
    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar14;
    if (uVar15 != 0) {
      local_138._0_2_ = CONCAT11(uVar33,uVar32);
      local_138._0_3_ = CONCAT12(uVar34,(undefined2)local_138);
      local_138._0_4_ = CONCAT13(bVar35,(undefined3)local_138);
      local_138._0_5_ = CONCAT14(uVar36,(undefined4)local_138);
      local_138._0_6_ = CONCAT15(uVar37,(undefined5)local_138);
      local_138._0_7_ = CONCAT16(uVar38,(undefined6)local_138);
      local_138 = CONCAT17(bVar39,(undefined7)local_138);
      ppVar5 = (local_158->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.elements_;
      local_150 = ppVar25;
      uStack_130 = uVar40;
      uStack_12f = uVar41;
      uStack_12e = uVar42;
      bStack_12d = bVar43;
      uStack_12c = uVar44;
      uStack_12b = uVar45;
      uStack_12a = uVar46;
      bStack_129 = bVar47;
      local_128 = pSVar23;
      do {
        uVar16 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        bVar13 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                 ::__eq(&key,&ppVar5[(long)ppVar25 * 0xf + (ulong)uVar16].first);
        DVar20 = SUB84(in_stack_fffffffffffffe98,0);
        if (bVar13) goto LAB_00256f34;
        uVar15 = uVar15 - 1 & uVar15;
      } while (uVar15 != 0);
      bVar14 = pgVar4[(long)ppVar25].m[0xf].n;
      h = local_148;
      pSVar23 = local_128;
      ppVar25 = local_150;
      uVar32 = (uchar)local_138;
      uVar33 = local_138._1_1_;
      uVar34 = local_138._2_1_;
      bVar35 = local_138._3_1_;
      uVar36 = local_138._4_1_;
      uVar37 = local_138._5_1_;
      uVar38 = local_138._6_1_;
      bVar39 = local_138._7_1_;
      uVar40 = uStack_130;
      uVar41 = uStack_12f;
      uVar42 = uStack_12e;
      bVar43 = bStack_12d;
      uVar44 = uStack_12c;
      uVar45 = uStack_12b;
      uVar46 = uStack_12a;
      bVar47 = bStack_129;
    }
    DVar20 = SUB84(in_stack_fffffffffffffe98,0);
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)sVar17 & 7] & bVar14) == 0) break;
    pSVar7 = (Symbol *)
             (local_158->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_size_mask;
    pSVar11 = &pSVar23->kind;
    pSVar23 = (Symbol *)((long)&pSVar23->kind + 1);
    ppVar25 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
               *)((ulong)((long)pSVar11 +
                         (long)((long)&(ppVar25->first).
                                       super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1)) &
                 (ulong)pSVar7);
  } while (pSVar23 <= pSVar7);
  if ((local_158->definitionMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
      .size_ctrl.size <
      (local_158->definitionMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
      .size_ctrl.ml) {
    ppVar25 = &local_f8;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>&,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
              (&local_a0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
                *)h,(size_t)pos0,sVar17,&local_15a,&key,ppVar25);
    DVar20 = SUB84(ppVar25,0);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>&,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
              (&local_a0,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
                *)h,sVar17,&local_15a,&key,&local_f8);
  }
LAB_00256f34:
  std::_Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::~_Vector_base
            ((_Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)&local_f8)
  ;
  std::_Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::~_Vector_base
            ((_Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)&local_88)
  ;
LAB_00257055:
  pCVar21 = local_158;
  if (local_140 == local_118) {
    sn = getExternDefinition(local_158,symbol->name,scope);
    if (sn != (SyntaxNode *)0x0) {
      if (symbol->kind == Definition && sn->kind == ExternModuleDecl) {
        checkExternModMatch(scope,(ModuleHeaderSyntax *)sn[6].parent,
                            (ModuleHeaderSyntax *)symbol->originatingSyntax[3].parent,
                            (DiagCode)0xb000d);
      }
      else if (symbol->kind == Primitive && sn->kind == ExternUdpDecl) {
        name._M_str = (char *)0xb000d;
        name._M_len = (size_t)(symbol->name)._M_str;
        checkExternUdpMatch((ast *)scope,(Scope *)sn[7].previewNode,
                            (UdpPortListSyntax *)symbol->originatingSyntax[4].previewNode,
                            (UdpPortListSyntax *)(symbol->name)._M_len,name,DVar20);
      }
      else {
        local_f8.first.
        super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
        super__Vector_impl_data._0_16_ = getExternNameToken(sn);
        oldLoc = parsing::Token::location((Token *)&local_f8);
LAB_002572b9:
        DVar20.subsystem = Lookup;
        DVar20.code = 0x2a;
LAB_00256f76:
        insertDefinition::anon_class_16_2_6b3e7b47::operator()(&reportRedefinition,oldLoc,DVar20);
      }
    }
  }
  else {
    pRVar3 = (local_158->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    local_a0._8_8_ = local_120->_M_len;
    local_a0.p = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                  *)local_120->_M_str;
    local_a0.pg = (group15<boost::unordered::detail::foa::plain_integral> *)&pRVar3->super_Scope;
    if (pRVar3 == (RootSymbol *)0x0) {
      local_a0.pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
    }
    hash = (string_view *)
           boost::unordered::detail::foa::mulx_mix::
           mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                     (local_148,
                      (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       *)&local_a0);
    uVar26 = (ulong)hash >>
             ((byte)(pCVar21->definitionMap).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                    .arrays.groups_size_index & 0x3f);
    lVar1 = ((ulong)hash & 0xff) * 4;
    uVar32 = (&UNK_0040eb5c)[lVar1];
    uVar33 = (&UNK_0040eb5d)[lVar1];
    uVar34 = (&UNK_0040eb5e)[lVar1];
    bVar35 = (&UNK_0040eb5f)[lVar1];
    uVar15 = (uint)hash;
    pSVar24 = (Scope *)0x0;
    uVar28 = uVar26;
    uVar36 = uVar32;
    uVar37 = uVar33;
    uVar38 = uVar34;
    bVar39 = bVar35;
    uVar40 = uVar32;
    uVar41 = uVar33;
    uVar42 = uVar34;
    bVar43 = bVar35;
    uVar44 = uVar32;
    uVar45 = uVar33;
    uVar46 = uVar34;
    bVar47 = bVar35;
    do {
      pgVar4 = (pCVar21->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.groups_;
      pgVar2 = pgVar4 + uVar28;
      local_68 = pgVar2->m[0].n;
      uStack_67 = pgVar2->m[1].n;
      uStack_66 = pgVar2->m[2].n;
      bStack_65 = pgVar2->m[3].n;
      uStack_64 = pgVar2->m[4].n;
      uStack_63 = pgVar2->m[5].n;
      uStack_62 = pgVar2->m[6].n;
      bStack_61 = pgVar2->m[7].n;
      uStack_60 = pgVar2->m[8].n;
      uStack_5f = pgVar2->m[9].n;
      uStack_5e = pgVar2->m[10].n;
      bStack_5d = pgVar2->m[0xb].n;
      uStack_5c = pgVar2->m[0xc].n;
      uStack_5b = pgVar2->m[0xd].n;
      uStack_5a = pgVar2->m[0xe].n;
      bVar14 = pgVar2->m[0xf].n;
      auVar31[0] = -(local_68 == uVar32);
      auVar31[1] = -(uStack_67 == uVar33);
      auVar31[2] = -(uStack_66 == uVar34);
      auVar31[3] = -(bStack_65 == bVar35);
      auVar31[4] = -(uStack_64 == uVar36);
      auVar31[5] = -(uStack_63 == uVar37);
      auVar31[6] = -(uStack_62 == uVar38);
      auVar31[7] = -(bStack_61 == bVar39);
      auVar31[8] = -(uStack_60 == uVar40);
      auVar31[9] = -(uStack_5f == uVar41);
      auVar31[10] = -(uStack_5e == uVar42);
      auVar31[0xb] = -(bStack_5d == bVar43);
      auVar31[0xc] = -(uStack_5c == uVar44);
      auVar31[0xd] = -(uStack_5b == uVar45);
      auVar31[0xe] = -(uStack_5a == uVar46);
      auVar31[0xf] = -(bVar14 == bVar47);
      uVar16 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
      bStack_59 = bVar14;
      if (uVar16 != 0) {
        local_118 = (Scope *)CONCAT17(bVar39,CONCAT16(uVar38,CONCAT15(uVar37,CONCAT14(uVar36,
                                                  CONCAT13(bVar35,CONCAT12(uVar34,CONCAT11(uVar33,
                                                  uVar32)))))));
        ppVar5 = (pCVar21->definitionMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                 .arrays.elements_;
        local_140 = pSVar24;
        local_138 = uVar28;
        local_120 = hash;
        uStack_110 = uVar40;
        uStack_10f = uVar41;
        uStack_10e = uVar42;
        bStack_10d = bVar43;
        uStack_10c = uVar44;
        uStack_10b = uVar45;
        uStack_10a = uVar46;
        bStack_109 = bVar47;
        do {
          uVar9 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          ppVar27 = ppVar5 + uVar28 * 0xf + (ulong)uVar9;
          bVar13 = std::
                   __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                   ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           *)&local_a0,&ppVar27->first);
          if (bVar13) goto LAB_002571e6;
          uVar16 = uVar16 - 1 & uVar16;
        } while (uVar16 != 0);
        bVar14 = pgVar4[uVar28].m[0xf].n;
        hash = local_120;
        pSVar24 = local_140;
        uVar28 = local_138;
        uVar32 = (uchar)local_118;
        uVar33 = local_118._1_1_;
        uVar34 = local_118._2_1_;
        bVar35 = local_118._3_1_;
        uVar36 = local_118._4_1_;
        uVar37 = local_118._5_1_;
        uVar38 = local_118._6_1_;
        bVar39 = local_118._7_1_;
        uVar40 = uStack_110;
        uVar41 = uStack_10f;
        uVar42 = uStack_10e;
        bVar43 = bStack_10d;
        uVar44 = uStack_10c;
        uVar45 = uStack_10b;
        uVar46 = uStack_10a;
        bVar47 = bStack_109;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar15 & 7] & bVar14) == 0) break;
      pSVar8 = (Scope *)(local_158->definitionMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                        .arrays.groups_size_mask;
      ppCVar12 = &pSVar24->compilation;
      pSVar24 = (Scope *)((long)&pSVar24->compilation + 1);
      uVar28 = (long)ppCVar12 + uVar28 + 1 & (ulong)pSVar8;
      pCVar21 = local_158;
    } while (pSVar24 <= pSVar8);
    if ((local_158->definitionMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
        .size_ctrl.size <
        (local_158->definitionMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                ((locator *)&local_f8,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
                  *)local_148,uVar26,(size_t)hash,(try_emplace_args_t *)&local_88,
                 (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  *)&local_a0);
      ppVar27 = (value_type_pointer)
                local_f8.first.
                super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                ((locator *)&local_f8,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
                  *)local_148,(size_t)hash,(try_emplace_args_t *)&local_88,
                 (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  *)&local_a0);
      ppVar27 = (value_type_pointer)
                local_f8.first.
                super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
LAB_002571e6:
    (ppVar27->second).second = true;
  }
  return;
}

Assistant:

void Compilation::insertDefinition(Symbol& symbol, const Scope& scope) {
    SLANG_ASSERT(!isFrozen());

    auto reportRedefinition = [&](SourceLocation oldLoc, DiagCode code) {
        if (!symbol.name.empty()) {
            auto& diag = scope.addDiag(code, symbol.location);
            diag << symbol.name;
            diag.addNote(diag::NotePreviousDefinition, oldLoc);
        }
    };

    // Record that the given scope contains this definition. If the scope is a compilation unit, add
    // it to the root scope instead so that lookups from other compilation units will find it.
    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    const bool isRoot = targetScope == root.get();
    auto key = std::tuple(symbol.name, targetScope);
    if (symbol.name.empty())
        return;

    if (auto it = definitionMap.find(key); it != definitionMap.end()) {
        // There is already a definition with this name in this scope.
        // If we're not at the root scope, it's a straightforward error.
        auto& defList = it->second.first;
        if (!isRoot) {
            SLANG_ASSERT(defList[0]);
            reportRedefinition(defList[0]->location, diag::DuplicateDefinition);
            return;
        }

        // Otherwise we have a duplicate at the root scope; figure out where
        // we should insert this definition. If they are in different libraries
        // then keep them sorted in priority order. If they're in the same library
        // then we want to error (or maybe warn).
        auto vecIt = std::ranges::lower_bound(defList, &symbol, [](auto a, auto b) {
            auto libA = a->getSourceLibrary();
            auto libB = b->getSourceLibrary();
            SLANG_ASSERT(libA && libB);
            return libA->priority < libB->priority;
        });

        if (vecIt != defList.end()) {
            bool warned = false;
            auto symLib = symbol.getSourceLibrary();
            for (auto v = vecIt; v != defList.end(); v++) {
                auto vSym = *v;
                auto vLib = vSym->getSourceLibrary();
                if (vLib == symLib) {
                    // Duplicate in the same library. If they are both the same kind
                    // then we report a warning and take the first one, otherwise
                    // we give a hard error.
                    if (vSym->kind == symbol.kind) {
                        if (!warned) {
                            // We keep going after this because there might also
                            // be a mismatching primitive / definition worth erroring about
                            // and the DuplicateDefinition warning can be suppressed.
                            reportRedefinition(vSym->location, diag::DuplicateDefinition);
                            warned = true;
                        }
                    }
                    else {
                        reportRedefinition(vSym->location, diag::Redefinition);
                        return;
                    }
                }
                else if (vLib->priority != symLib->priority) {
                    // We know for sure there are no more duplicates because the
                    // library and/or the priority has changed.
                    break;
                }
            }
        }

        defList.insert(vecIt, &symbol);
    }
    else {
        definitionMap.emplace(key, std::pair{std::vector{&symbol}, !isRoot});
    }

    if (isRoot) {
        // TODO: how do extern modules work with libraries?
        if (auto externDef = getExternDefinition(symbol.name, scope)) {
            auto syntax = symbol.getSyntax();
            SLANG_ASSERT(syntax);

            if (externDef->kind == SyntaxKind::ExternModuleDecl &&
                symbol.kind == SymbolKind::Definition) {
                checkExternModMatch(scope, *externDef->as<ExternModuleDeclSyntax>().header,
                                    *syntax->as<ModuleDeclarationSyntax>().header,
                                    diag::ExternDeclMismatchImpl);
            }
            else if (externDef->kind == SyntaxKind::ExternUdpDecl &&
                     symbol.kind == SymbolKind::Primitive) {
                checkExternUdpMatch(scope, *externDef->as<ExternUdpDeclSyntax>().portList,
                                    *syntax->as<UdpDeclarationSyntax>().portList, symbol.name,
                                    diag::ExternDeclMismatchImpl);
            }
            else {
                reportRedefinition(getExternNameToken(*externDef).location(), diag::Redefinition);
            }
        }
    }
    else {
        // Record the fact that we have nested modules with this name.
        definitionMap[std::tuple(symbol.name, root.get())].second = true;
    }
}